

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

int htmlSaveFile(char *filename,xmlDocPtr cur)

{
  xmlCharEncoding xVar1;
  xmlChar *name;
  xmlOutputBufferPtr buf_00;
  xmlCharEncoding enc;
  int ret;
  char *encoding;
  xmlCharEncodingHandlerPtr handler;
  xmlOutputBufferPtr buf;
  xmlDocPtr cur_local;
  char *filename_local;
  
  encoding = (char *)0x0;
  if ((cur == (xmlDocPtr)0x0) || (filename == (char *)0x0)) {
    filename_local._4_4_ = -1;
  }
  else {
    xmlInitParser();
    name = htmlGetMetaEncoding(cur);
    if (name == (xmlChar *)0x0) {
      encoding = (char *)xmlFindCharEncodingHandler("HTML");
      if ((xmlCharEncodingHandlerPtr)encoding == (xmlCharEncodingHandlerPtr)0x0) {
        encoding = (char *)xmlFindCharEncodingHandler("ascii");
      }
    }
    else {
      xVar1 = xmlParseCharEncoding((char *)name);
      if ((xVar1 != XML_CHAR_ENCODING_UTF8) &&
         (encoding = (char *)xmlFindCharEncodingHandler((char *)name),
         (xmlCharEncodingHandlerPtr)encoding == (xmlCharEncodingHandlerPtr)0x0)) {
        htmlSaveErr(0x57b,(xmlNodePtr)0x0,(char *)name);
      }
    }
    buf_00 = xmlOutputBufferCreateFilename
                       (filename,(xmlCharEncodingHandlerPtr)encoding,cur->compression);
    if (buf_00 == (xmlOutputBufferPtr)0x0) {
      filename_local._4_4_ = 0;
    }
    else {
      htmlDocContentDumpOutput(buf_00,cur,(char *)0x0);
      filename_local._4_4_ = xmlOutputBufferClose(buf_00);
    }
  }
  return filename_local._4_4_;
}

Assistant:

int
htmlSaveFile(const char *filename, xmlDocPtr cur) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    encoding = (const char *) htmlGetMetaEncoding(cur);

    if (encoding != NULL) {
	xmlCharEncoding enc;

	enc = xmlParseCharEncoding(encoding);
	if (enc != XML_CHAR_ENCODING_UTF8) {
	    handler = xmlFindCharEncodingHandler(encoding);
	    if (handler == NULL)
		htmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL, encoding);
	}
    } else {
        /*
         * Fallback to HTML or ASCII when the encoding is unspecified
         */
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("HTML");
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("ascii");
    }

    /*
     * save the content to a temp buffer.
     */
    buf = xmlOutputBufferCreateFilename(filename, handler, cur->compression);
    if (buf == NULL) return(0);

    htmlDocContentDumpOutput(buf, cur, NULL);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}